

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylinderShape.cpp
# Opt level: O1

void __thiscall
cbtCylinderShape::calculateLocalInertia(cbtCylinderShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  uVar1 = *(ulong *)(this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats;
  fVar4 = (float)*(undefined8 *)
                  ((this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats + 2);
  fVar8 = fVar4;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  fVar7 = fVar8;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar5 = fVar7;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar1;
  fVar8 = (float)uVar1 + fVar8;
  auVar3 = vmovshdup_avx(auVar3);
  fVar7 = auVar3._0_4_ + fVar7;
  iVar2 = *(int *)&(this->super_cbtConvexInternalShape).field_0x44;
  fVar6 = fVar7;
  if ((iVar2 != 0) && (fVar6 = fVar8, fVar8 = fVar7, iVar2 == 2)) {
    fVar8 = fVar5 + fVar4;
  }
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(mass * 0.25 * fVar6 * fVar6)),ZEXT416((uint)(mass / 12.0))
                           ,ZEXT416((uint)(fVar8 * fVar8 * 4.0)));
  fVar5 = auVar3._0_4_;
  fVar4 = mass * 0.5 * fVar6 * fVar6;
  fVar7 = fVar4;
  fVar8 = fVar5;
  if ((iVar2 != 0) && (fVar7 = fVar5, fVar8 = fVar4, iVar2 == 2)) {
    fVar8 = fVar5;
    fVar5 = fVar4;
  }
  inertia->m_floats[0] = fVar7;
  inertia->m_floats[1] = fVar8;
  inertia->m_floats[2] = fVar5;
  inertia->m_floats[3] = 0.0;
  return;
}

Assistant:

void cbtCylinderShape::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
//Until Bullet 2.77 a box approximation was used, so uncomment this if you need backwards compatibility
//#define USE_BOX_INERTIA_APPROXIMATION 1
#ifndef USE_BOX_INERTIA_APPROXIMATION

	/*
	cylinder is defined as following:
	*
	* - principle axis aligned along y by default, radius in x, z-value not used
	* - for cbtCylinderShapeX: principle axis aligned along x, radius in y direction, z-value not used
	* - for cbtCylinderShapeZ: principle axis aligned along z, radius in x direction, y-value not used
	*
	*/

	cbtScalar radius2;                                    // square of cylinder radius
	cbtScalar height2;                                    // square of cylinder height
	cbtVector3 halfExtents = getHalfExtentsWithMargin();  // get cylinder dimension
	cbtScalar div12 = mass / 12.f;
	cbtScalar div4 = mass / 4.f;
	cbtScalar div2 = mass / 2.f;
	int idxRadius, idxHeight;

	switch (m_upAxis)  // get indices of radius and height of cylinder
	{
		case 0:  // cylinder is aligned along x
			idxRadius = 1;
			idxHeight = 0;
			break;
		case 2:  // cylinder is aligned along z
			idxRadius = 0;
			idxHeight = 2;
			break;
		default:  // cylinder is aligned along y
			idxRadius = 0;
			idxHeight = 1;
	}

	// calculate squares
	radius2 = halfExtents[idxRadius] * halfExtents[idxRadius];
	height2 = cbtScalar(4.) * halfExtents[idxHeight] * halfExtents[idxHeight];

	// calculate tensor terms
	cbtScalar t1 = div12 * height2 + div4 * radius2;
	cbtScalar t2 = div2 * radius2;

	switch (m_upAxis)  // set diagonal elements of inertia tensor
	{
		case 0:  // cylinder is aligned along x
			inertia.setValue(t2, t1, t1);
			break;
		case 2:  // cylinder is aligned along z
			inertia.setValue(t1, t1, t2);
			break;
		default:  // cylinder is aligned along y
			inertia.setValue(t1, t2, t1);
	}
#else   //USE_BOX_INERTIA_APPROXIMATION
	//approximation of box shape
	cbtVector3 halfExtents = getHalfExtentsWithMargin();

	cbtScalar lx = cbtScalar(2.) * (halfExtents.x());
	cbtScalar ly = cbtScalar(2.) * (halfExtents.y());
	cbtScalar lz = cbtScalar(2.) * (halfExtents.z());

	inertia.setValue(mass / (cbtScalar(12.0)) * (ly * ly + lz * lz),
					 mass / (cbtScalar(12.0)) * (lx * lx + lz * lz),
					 mass / (cbtScalar(12.0)) * (lx * lx + ly * ly));
#endif  //USE_BOX_INERTIA_APPROXIMATION
}